

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFilePostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  char *__s;
  string configProp;
  string sStack_38;
  
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&sStack_38,config);
    std::__cxx11::string::append((char *)&sStack_38);
    __s = GetProperty(this,&sStack_38);
    bVar1 = IsImported(this);
    if ((__s != (char *)0x0 && !bVar1) &&
       ((bVar1 = IsAppBundleOnApple(this), bVar1 || (bVar1 = IsFrameworkOnApple(this), bVar1)))) {
      __s = (char *)0x0;
    }
    std::__cxx11::string::~string((string *)&sStack_38);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&sStack_38);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePostfix(const std::string& config) const
{
  const char* postfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    postfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (!this->IsImported() && postfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      postfix = nullptr;
    }
  }
  return postfix ? postfix : std::string();
}